

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O3

void lua_sethook(lua_State *L,lua_Hook func,int mask,int count)

{
  lua_Hook p_Var1;
  CallInfo *pCVar2;
  uint uVar3;
  
  uVar3 = mask;
  if (func == (lua_Hook)0x0) {
    uVar3 = 0;
  }
  p_Var1 = (lua_Hook)0x0;
  if (mask != 0) {
    p_Var1 = func;
  }
  L->hook = p_Var1;
  L->basehookcount = count;
  L->hookcount = count;
  L->hookmask = uVar3 & 0xff;
  if (uVar3 != 0) {
    for (pCVar2 = L->ci; pCVar2 != (CallInfo *)0x0; pCVar2 = pCVar2->previous) {
      if ((pCVar2->callstatus & 2) == 0) {
        (pCVar2->u).l.trap = 1;
      }
    }
  }
  return;
}

Assistant:

LUA_API void lua_sethook (lua_State *L, lua_Hook func, int mask, int count) {
  if (func == NULL || mask == 0) {  /* turn off hooks? */
    mask = 0;
    func = NULL;
  }
  L->hook = func;
  L->basehookcount = count;
  resethookcount(L);
  L->hookmask = cast_byte(mask);
  if (mask)
    settraps(L->ci);  /* to trace inside 'luaV_execute' */
}